

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_ec_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,int is_sk,EVP_PKEY *pk)

{
  libssh2_curve_type lVar1;
  int iVar2;
  size_t sStack_78;
  libssh2_curve_type type;
  size_t octal_len;
  uchar *octal_value;
  size_t key_len;
  size_t method_buf_len;
  uchar *key;
  uchar *method_buf;
  uchar *p;
  int rc;
  int is_sk_local;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  LIBSSH2_SESSION *session_local;
  
  p._0_4_ = 0;
  key = (uchar *)0x0;
  key_len = 0;
  octal_value = (uchar *)0x0;
  octal_len = 0;
  p._4_4_ = is_sk;
  _rc = pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = (uchar **)session;
  lVar1 = _libssh2_ecdsa_get_curve_type(pk);
  if (p._4_4_ == 0) {
    key_len = 0x13;
  }
  else {
    key_len = 0x22;
  }
  key = (uchar *)(*(code *)method_local[1])(key_len,method_local);
  if (key == (uchar *)0x0) {
    iVar2 = _libssh2_error((LIBSSH2_SESSION *)method_local,-6,"out of memory");
    return iVar2;
  }
  if (p._4_4_ == 0) {
    if (lVar1 == LIBSSH2_EC_CURVE_NISTP256) {
      memcpy(key,"ecdsa-sha2-nistp256",key_len);
    }
    else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
      memcpy(key,"ecdsa-sha2-nistp384",key_len);
    }
    else {
      if (lVar1 != LIBSSH2_EC_CURVE_NISTP521) {
        p._0_4_ = -1;
        goto LAB_00116455;
      }
      memcpy(key,"ecdsa-sha2-nistp521",key_len);
    }
  }
  else {
    memcpy(key,"sk-ecdsa-sha2-nistp256@openssh.com",key_len);
  }
  sStack_78 = 0x85;
  octal_len = (*(code *)method_local[1])(0x85,method_local);
  EVP_PKEY_get_octet_string_param(pk,"pub",octal_len,sStack_78,&stack0xffffffffffffff88);
  octal_value = (uchar *)(key_len + 0x14 + sStack_78);
  method_buf_len = (*(code *)method_local[1])(octal_value,method_local);
  if ((uchar *)method_buf_len == (uchar *)0x0) {
    p._0_4_ = -1;
  }
  else {
    method_buf = (uchar *)method_buf_len;
    _libssh2_store_str(&method_buf,(char *)key,key_len);
    if (p._4_4_ == 0) {
      _libssh2_store_str(&method_buf,(char *)(key + 0xb),8);
    }
    else {
      _libssh2_store_str(&method_buf,"nistp256",8);
    }
    _libssh2_store_str(&method_buf,(char *)octal_len,sStack_78);
    *method_len_local = (size_t)key;
    if (pubkeydata_local != (uchar **)0x0) {
      *pubkeydata_local = (uchar *)key_len;
    }
    *pubkeydata_len_local = method_buf_len;
    if (_rc != (size_t *)0x0) {
      *_rc = (size_t)octal_value;
    }
  }
LAB_00116455:
  if (octal_len != 0) {
    free((void *)octal_len);
  }
  if ((int)p == 0) {
    session_local._4_4_ = 0;
  }
  else {
    if (key != (uchar *)0x0) {
      (*(code *)method_local[3])(key,method_local);
    }
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
gen_publickey_from_ec_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          int is_sk,
                          EVP_PKEY *pk)
{
    int rc = 0;
    unsigned char *p;
    unsigned char *method_buf = NULL;
    unsigned char *key;
    size_t  method_buf_len = 0;
    size_t  key_len = 0;
    unsigned char *octal_value = NULL;
    size_t octal_len;
    libssh2_curve_type type;

#ifdef USE_OPENSSL_3
    _libssh2_debug((session,
       LIBSSH2_TRACE_AUTH,
       "Computing public key from EC private key envelope"));

    type = _libssh2_ecdsa_get_curve_type(pk);
#else
    EC_KEY *ec = NULL;
    const EC_POINT *public_key;
    const EC_GROUP *group;
    BN_CTX *bn_ctx = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from EC private key envelope"));

    bn_ctx = BN_CTX_new();
    if(!bn_ctx)
        return -1;

    ec = EVP_PKEY_get1_EC_KEY(pk);
    if(!ec) {
        rc = -1;
        goto clean_exit;
    }

    public_key = EC_KEY_get0_public_key(ec);
    group = EC_KEY_get0_group(ec);
    type = _libssh2_ecdsa_get_curve_type(ec);
#endif

    if(is_sk)
        method_buf_len = 34;
    else
        method_buf_len = 19;

    method_buf = LIBSSH2_ALLOC(session, method_buf_len);
    if(!method_buf) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "out of memory");
    }

    if(is_sk) {
        memcpy(method_buf, "sk-ecdsa-sha2-nistp256@openssh.com",
               method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP256) {
        memcpy(method_buf, "ecdsa-sha2-nistp256", method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        memcpy(method_buf, "ecdsa-sha2-nistp384", method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        memcpy(method_buf, "ecdsa-sha2-nistp521", method_buf_len);
    }
    else {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_ERROR,
                       "Unsupported EC private key type"));
        rc = -1;
        goto clean_exit;
    }

#ifdef USE_OPENSSL_3
    octal_len = EC_MAX_POINT_LEN;
    octal_value = LIBSSH2_ALLOC(session, octal_len);
    EVP_PKEY_get_octet_string_param(pk, OSSL_PKEY_PARAM_PUB_KEY,
                                    octal_value, octal_len, &octal_len);
#else
    /* get length */
    octal_len = EC_POINT_point2oct(group, public_key,
                                   POINT_CONVERSION_UNCOMPRESSED,
                                   NULL, 0, bn_ctx);
    if(octal_len > EC_MAX_POINT_LEN) {
        rc = -1;
        goto clean_exit;
    }

    octal_value = malloc(octal_len);
    if(!octal_value) {
        rc = -1;
        goto clean_exit;
    }

    /* convert to octal */
    if(EC_POINT_point2oct(group, public_key, POINT_CONVERSION_UNCOMPRESSED,
       octal_value, octal_len, bn_ctx) != octal_len) {
        rc = -1;
        goto clean_exit;
    }
#endif

    /* Key form is: type_len(4) + type(method_buf_len) + domain_len(4)
       + domain(8) + pub_key_len(4) + pub_key(~65). */
    key_len = 4 + method_buf_len + 4 + 8 + 4 + octal_len;
    key = LIBSSH2_ALLOC(session, key_len);
    if(!key) {
        rc = -1;
        goto clean_exit;
    }

    /* Process key encoding. */
    p = key;

    /* Key type */
    _libssh2_store_str(&p, (const char *)method_buf, method_buf_len);

    /* Name domain */
    if(is_sk) {
        _libssh2_store_str(&p, "nistp256", 8);
    }
    else {
        _libssh2_store_str(&p, (const char *)method_buf + 11, 8);
    }

    /* Public key */
    _libssh2_store_str(&p, (const char *)octal_value, octal_len);

    *method = method_buf;
    if(method_len) {
        *method_len = method_buf_len;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }

clean_exit:

#ifndef USE_OPENSSL_3
    if(ec)
        EC_KEY_free(ec);

    if(bn_ctx) {
        BN_CTX_free(bn_ctx);
    }
#endif

    if(octal_value)
        free(octal_value);

    if(rc == 0)
        return 0;

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    return -1;
}